

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_A_FreezeDeath(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  ulong uVar2;
  VM_UBYTE VVar3;
  DObject *this;
  player_t *ppVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  AActor *pAVar8;
  AActor *this_00;
  char *__assertion;
  FSoundID local_24;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005564e0;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_00556315:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar5 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar5) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005564e0;
        }
      }
      if (numparam == 1) goto LAB_00556395;
      VVar3 = param[1].field_0.field_3.Type;
      if (VVar3 != 0xff) {
        if (VVar3 != '\x03') goto LAB_005564d0;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar5 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar5) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005564e0;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_005564d0;
      }
      if ((((uint)numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
         ((VVar3 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00556395:
        iVar6 = FRandom::operator()(&pr_freezedeath);
        iVar7 = FRandom::operator()(&pr_freezedeath);
        this_00->tics = iVar7 + iVar6 + 0x4b;
        uVar2._0_4_ = this_00->flags;
        uVar2._4_4_ = this_00->flags2;
        this_00->flags = (ActorFlags)(int)(uVar2 | 0x4160080080006);
        this_00->flags2 = (ActorFlags2)(int)((uVar2 | 0x4160080080006) >> 0x20);
        pbVar1 = (byte *)((long)&(this_00->flags3).Value + 2);
        *pbVar1 = *pbVar1 | 0x20;
        pAVar8 = AActor::GetDefault(this_00);
        this_00->Height = pAVar8->Height;
        if (((this_00->RenderStyle).field_0.BlendOp & 0xfc) == 4) {
          this_00->RenderStyle = LegacyRenderStyles[1];
        }
        S_FindSound("misc/freeze");
        S_Sound(this_00,4,&local_24,1.0,1.0);
        if (((this_00->flags).Value & 0x40000000) != 0) {
          this_00->Alpha = 1.0;
          this_00->visdir = '\0';
        }
        ppVar4 = this_00->player;
        if (ppVar4 == (player_t *)0x0) {
          if ((((this_00->flags3).Value & 0x2000) != 0) && (this_00->special != 0)) {
            P_ExecuteSpecial(this_00->special,(line_t *)0x0,this_00,false,this_00->args[0],
                             this_00->args[1],this_00->args[2],this_00->args[3],this_00->args[4]);
            this_00->special = 0;
          }
        }
        else {
          ppVar4->damagecount = 0;
          ppVar4->bonuscount = 0;
          ppVar4->poisoncount = 0;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005564e0;
    }
    if (this_00 == (AActor *)0x0) goto LAB_00556315;
  }
LAB_005564d0:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005564e0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0xb9,"int AF_A_FreezeDeath(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeath)
{
	PARAM_ACTION_PROLOGUE;

	int t = pr_freezedeath();
	self->tics = 75+t+pr_freezedeath();
	self->flags |= MF_SOLID|MF_SHOOTABLE|MF_NOBLOOD|MF_ICECORPSE;
	self->flags2 |= MF2_PUSHABLE|MF2_TELESTOMP|MF2_PASSMOBJ|MF2_SLIDE;
	self->flags3 |= MF3_CRASHED;
	self->Height = self->GetDefault()->Height;
	// Remove fuzz effects from frozen actors.
	if (self->RenderStyle.BlendOp >= STYLEOP_Fuzz && self->RenderStyle.BlendOp <= STYLEOP_FuzzOrRevSub)
	{
		self->RenderStyle = STYLE_Normal;
	}

	S_Sound (self, CHAN_BODY, "misc/freeze", 1, ATTN_NORM);

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1;
		self->visdir = 0;
	}

	if (self->player)
	{
		self->player->damagecount = 0;
		self->player->poisoncount = 0;
		self->player->bonuscount = 0;
	}
	else if (self->flags3 & MF3_ISMONSTER && self->special)
	{ // Initiate monster death actions
		P_ExecuteSpecial(self->special, NULL, self, false, self->args[0],
			self->args[1], self->args[2], self->args[3], self->args[4]);
		self->special = 0;
	}
	return 0;
}